

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O3

TileOffsets * __thiscall
Imf_2_5::MultiPartInputFile::Data::createTileOffsets(Data *this,Header *header)

{
  int maxX;
  int minX;
  int minY;
  int maxY;
  Box2i *pBVar1;
  TileDescription *pTVar2;
  TileOffsets *this_00;
  int *numYTiles;
  int *numXTiles;
  int numYLevels;
  int numXLevels;
  TileDescription tileDesc;
  
  pBVar1 = Header::dataWindow(header);
  maxX = (pBVar1->max).x;
  minX = (pBVar1->min).x;
  minY = (pBVar1->min).y;
  maxY = (pBVar1->max).y;
  numXTiles = (int *)0x0;
  numYTiles = (int *)0x0;
  pTVar2 = Header::tileDescription(header);
  tileDesc.xSize = pTVar2->xSize;
  tileDesc.ySize = pTVar2->ySize;
  tileDesc.mode = pTVar2->mode;
  tileDesc.roundingMode = pTVar2->roundingMode;
  precalculateTileInfo(&tileDesc,minX,maxX,minY,maxY,&numXTiles,&numYTiles,&numXLevels,&numYLevels);
  this_00 = (TileOffsets *)operator_new(0x28);
  TileOffsets::TileOffsets(this_00,tileDesc.mode,numXLevels,numYLevels,numXTiles,numYTiles);
  if (numXTiles != (int *)0x0) {
    operator_delete__(numXTiles);
  }
  if (numYTiles != (int *)0x0) {
    operator_delete__(numYTiles);
  }
  return this_00;
}

Assistant:

TileOffsets*
MultiPartInputFile::Data::createTileOffsets(const Header& header)
{
    //
    // Get the dataWindow information
    //

    const Box2i &dataWindow = header.dataWindow();
    int minX = dataWindow.min.x;
    int maxX = dataWindow.max.x;
    int minY = dataWindow.min.y;
    int maxY = dataWindow.max.y;

    //
    // Precompute level and tile information
    //

    int* numXTiles = nullptr;
    int* numYTiles = nullptr;
    int numXLevels, numYLevels;
    TileDescription tileDesc = header.tileDescription();
    try
    {

        precalculateTileInfo (tileDesc,
                            minX, maxX,
                            minY, maxY,
                            numXTiles, numYTiles,
                            numXLevels, numYLevels);

        TileOffsets* tileOffsets = new TileOffsets (tileDesc.mode,
                                                    numXLevels,
                                                    numYLevels,
                                                    numXTiles,
                                                    numYTiles);
        delete [] numXTiles;
        delete [] numYTiles;

        return tileOffsets;

    }
    catch(...)
    {
        delete [] numXTiles;
        delete [] numYTiles;
        throw;
    }

}